

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamical-system-simulator.cpp
# Opt level: O2

Vector __thiscall
stateObservation::DynamicalSystemSimulator::getCurrentState(DynamicalSystemSimulator *this)

{
  uint time;
  Index extraout_RDX;
  long in_RSI;
  Vector VVar1;
  void *local_30 [3];
  
  time = IndexedMatrixArray::getLastIndex((IndexedMatrixArray *)(in_RSI + 0x10));
  IndexedMatrixArray::operator[]((Matrix *)local_30,(IndexedMatrixArray *)(in_RSI + 0x10),time);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_30);
  free(local_30[0]);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector DynamicalSystemSimulator::getCurrentState() const
    {
        return x_[x_.getLastIndex()];
    }